

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O2

ThreadCache * tcmalloc::ThreadCache::Current(void)

{
  ThreadCache *pTVar1;
  long in_FS_OFFSET;
  
  pTVar1 = *(ThreadCache **)(in_FS_OFFSET + -8);
  if (pTVar1 == (ThreadCache *)0x0) {
    std::mutex::lock((mutex *)global_lock);
    if (global_inited == 0) {
      GlobalInit();
    }
    if ((global_inited & 1) == 0) {
      __assert_fail("global_inited",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/thread_cache.hpp"
                    ,0xf0,"static ThreadCache *tcmalloc::ThreadCache::Current()");
    }
    pTVar1 = FixedAllocator<tcmalloc::ThreadCache>::Alloc
                       ((FixedAllocator<tcmalloc::ThreadCache> *)thread_cache_allocator);
    Init(pTVar1);
    *(ThreadCache **)(in_FS_OFFSET + -8) = pTVar1;
    pthread_mutex_unlock((pthread_mutex_t *)global_lock);
    pthread_setspecific(spec_key,pTVar1);
    std::mutex::lock((mutex *)global_lock);
    pTVar1->prev = (ThreadCache *)cache_list;
    pTVar1->next = (ThreadCache *)cache_list._4152_8_;
    *(ThreadCache **)(cache_list._4152_8_ + 0x1030) = pTVar1;
    cache_list_size = cache_list_size + 1;
    cache_list._4152_8_ = pTVar1;
    pthread_mutex_unlock((pthread_mutex_t *)global_lock);
    pTVar1 = *(ThreadCache **)(in_FS_OFFSET + -8);
  }
  return pTVar1;
}

Assistant:

static ThreadCache* Current() {
        if (tls_cache != nullptr) return tls_cache;

        global_lock.lock();
        if (!global_inited) {
            ThreadCache::GlobalInit();
        }
        assert(global_inited);
        ThreadCache* cache = thread_cache_allocator.Alloc();
        cache->Init();
        // pthread_setspecific可能调用malloc递归回这个函数
        // 先设置tls_cache递归基，再调用pthread_setspecific
        tls_cache = cache;
        global_lock.unlock();
        pthread_setspecific(spec_key, cache);

        global_lock.lock();
        CacheListInsert(&cache_list, cache);
        global_lock.unlock();
        return tls_cache;
    }